

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree_iterators.h
# Opt level: O3

void __thiscall
Gudhi::
Simplex_tree_boundary_opposite_vertex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>
::
Simplex_tree_boundary_opposite_vertex_simplex_iterator<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>>
          (Simplex_tree_boundary_opposite_vertex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>
           *this,Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *st,
          vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
          *sh)

{
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *ppVar1;
  stored_size_type sVar2;
  pointer ppVar3;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
  *pSVar4;
  int iVar5;
  size_type sz;
  undefined8 *puVar6;
  pointer bg;
  Siblings *pSVar7;
  pointer local_18;
  
  ppVar1 = sh->m_ptr;
  *(int *)this = ppVar1->first;
  *(Vertex_handle *)(this + 4) = st->null_vertex_;
  *(undefined8 *)(this + 0xa8) = 0;
  *(undefined8 *)(this + 0xb0) = 0;
  *(undefined8 *)(this + 0xb8) = 0;
  *(int *)(this + 0xc0) = ppVar1->first;
  *(Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> **)(this + 200) = st;
  sVar2 = (st->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size;
  if ((sVar2 != 0) &&
     ((ppVar3 = (st->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start, ppVar3->first != 0
      || (ppVar3[sVar2 - 1].first != (int)sVar2 + -1)))) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = "The set of vertices is not { 0, ..., n } without holes";
    __cxa_throw(puVar6,&char_const*::typeinfo,0);
  }
  pSVar7 = (sh->m_ptr->second).children_;
  iVar5 = pSVar7->parent_;
  if (iVar5 == sh->m_ptr->first) {
    pSVar7 = pSVar7->oncles_;
    iVar5 = pSVar7->parent_;
  }
  *(int *)(this + 4) = iVar5;
  pSVar4 = pSVar7->oncles_;
  *(Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
    **)(this + 0xb0) = pSVar4;
  if (pSVar4 != (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
                 *)0x0) {
    if (pSVar4->oncles_ ==
        (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
         *)0x0) {
      local_18 = (pSVar4->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
      if (iVar5 != 0 && local_18 == (pointer)0x0) {
        __assert_fail("x.m_ptr || !off","/usr/include/boost/container/vector.hpp",0xab,
                      "vec_iterator<Pointer, IsConst> boost::container::operator+(const vec_iterator<Pointer, IsConst> &, difference_type)"
                     );
      }
      local_18 = local_18 + iVar5;
    }
    else {
      boost::container::dtl::
      flat_tree<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>,_boost::container::dtl::select1st<int>,_std::less<int>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_>_>
      ::find((flat_tree<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>,_boost::container::dtl::select1st<int>,_std::less<int>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_>_>
              *)&local_18,(key_type *)&pSVar4->members_);
    }
    *(pointer *)(this + 0xb8) = local_18;
  }
  return;
}

Assistant:

Simplex_tree_boundary_opposite_vertex_simplex_iterator(SimplexTree const* st, SimplexHandle sh)
      : last_(sh->first),
        next_(st->null_vertex()),
        sib_(nullptr),
        baov_(st->null_simplex(), sh->first),
        st_(st) {
    // Only check once at the beginning instead of for every increment, as this is expensive.
    if constexpr (SimplexTree::Options::contiguous_vertices)
      GUDHI_CHECK(st_->contiguous_vertices(), "The set of vertices is not { 0, ..., n } without holes");
    Siblings const* sib = st->self_siblings(sh);
    next_ = sib->parent();
    sib_ = sib->oncles();
    if (sib_ != nullptr) {
      if constexpr (SimplexTree::Options::contiguous_vertices &&
                    !SimplexTree::Options::stable_simplex_handles) {
        if (sib_->oncles() == nullptr)
          // Only relevant for edges
          baov_.first = sib_->members_.begin() + next_;
        else
          baov_.first = sib_->find(next_);
      } else {
        baov_.first = sib_->find(next_);
      }
    }
  }